

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_beam.cpp
# Opt level: O1

ON_3dPoint * __thiscall
ON_Extrusion::PathStart(ON_3dPoint *__return_storage_ptr__,ON_Extrusion *this)

{
  double dVar1;
  bool bVar2;
  
  __return_storage_ptr__->z = ON_3dPoint::UnsetPoint.z;
  dVar1 = ON_3dPoint::UnsetPoint.y;
  __return_storage_ptr__->x = ON_3dPoint::UnsetPoint.x;
  __return_storage_ptr__->y = dVar1;
  dVar1 = (this->m_t).m_t[0];
  if ((0.0 <= dVar1) && (dVar1 <= 1.0)) {
    bVar2 = ON_Line::IsValid(&this->m_path);
    if (bVar2) {
      ON_Line::PointAt(__return_storage_ptr__,&this->m_path,dVar1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

ON_3dPoint ON_Extrusion::PathStart() const
{
  ON_3dPoint P(ON_3dPoint::UnsetPoint);
  const double t = m_t.m_t[0];
  if ( 0.0 <= t && t <= 1.0 && m_path.IsValid() )
    P = m_path.PointAt(t);
  return P;
}